

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

void rtcSetGeometryVertexAttributeTopology
               (RTCGeometry hgeometry,uint vertexAttributeID,uint topologyID)

{
  undefined8 *puVar1;
  DeviceEnterLeave enterleave;
  DeviceEnterLeave local_50;
  long local_48;
  
  if (hgeometry != (RTCGeometry)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&local_50,hgeometry);
    (**(code **)(*(long *)hgeometry + 0xb0))(hgeometry,vertexAttributeID,topologyID);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&local_50);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50.device = (Device *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument","");
  *puVar1 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 2),local_50.device,
             (undefined1 *)
             ((long)&((local_50.device)->super_State).super_RefCount._vptr_RefCount + local_48));
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcSetGeometryVertexAttributeTopology(RTCGeometry hgeometry, unsigned int vertexAttributeID, unsigned int topologyID)
  {
    Geometry* geometry = (Geometry*) hgeometry;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcSetGeometryVertexAttributeTopology);
    RTC_VERIFY_HANDLE(hgeometry);
    RTC_ENTER_DEVICE(hgeometry);
    geometry->setVertexAttributeTopology(vertexAttributeID, topologyID);
    RTC_CATCH_END2(geometry);
  }